

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O2

bool __thiscall
tinyusdz::SkelAnimation::get_rotations
          (SkelAnimation *this,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *vals,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> v;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> local_58
  ;
  
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_58._ts._17_8_ = 0;
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_58._value.
  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._value.
  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_58._value.
  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
  super__Vector_impl_data._M_finish._2_6_ = 0;
  local_58._value.
  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_58._18_8_ = 0;
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
          ::get_value(&this->rotations,&local_58);
  if (bVar1) {
    bVar1 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::get(&local_58,t,vals,tinterp);
  }
  else {
    bVar1 = false;
  }
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::
  ~Animatable(&local_58);
  return bVar1;
}

Assistant:

bool SkelAnimation::get_rotations(std::vector<value::quatf> *vals,
                                  const double t,
                                  const value::TimeSampleInterpolationType tinterp) {
  Animatable<std::vector<value::quatf>> v;
  if (rotations.get_value(&v)) {
    // Evaluate at time `t` with `tinterp` interpolation
    return v.get(t, vals, tinterp);
  }

  return false;
}